

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_dead_builtin_varyings.cpp
# Opt level: O1

ir_visitor_status __thiscall
anon_unknown.dwarf_194ba1::varying_info_visitor::visit_enter
          (varying_info_visitor *this,ir_dereference_array *ir)

{
  GLenum GVar1;
  glsl_type *pgVar2;
  char *__s1;
  ir_constant *piVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  ir_variable *piVar6;
  
  iVar4 = (*(ir->super_ir_dereference).super_ir_rvalue.super_ir_instruction._vptr_ir_instruction[8])
                    (ir);
  piVar6 = (ir_variable *)CONCAT44(extraout_var,iVar4);
  if (piVar6 == (ir_variable *)0x0) {
    return visit_continue;
  }
  if ((*(uint *)&piVar6->data >> 0xc & (ir_var_mode_count|ir_var_shader_shared)) != this->mode) {
    return visit_continue;
  }
  pgVar2 = piVar6->type;
  if (pgVar2->field_0x4 != '\x11') {
    return visit_continue;
  }
  __s1 = piVar6->name;
  if (__s1 != (char *)0x0) {
    if (*__s1 != 'g') {
      return visit_continue;
    }
    if (__s1[1] != 'l') {
      return visit_continue;
    }
    if (__s1[2] != '_') {
      return visit_continue;
    }
    if (this->find_frag_outputs == true) {
      iVar4 = strcmp(__s1,"gl_FragData");
      if (iVar4 != 0) {
        return visit_continue;
      }
      this->fragdata_array = piVar6;
      piVar3 = (ir_constant *)ir->array_index;
      if ((piVar3 != (ir_constant *)0x0) &&
         ((piVar3->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_constant)) {
        uVar5 = ir_constant::get_uint_component(piVar3,0);
        this->fragdata_usage = this->fragdata_usage | 1 << ((byte)uVar5 & 0x1f);
        GVar1 = piVar6->type->gl_type;
        if (GVar1 - 0x8b50 < 3) {
          return visit_continue_with_parent;
        }
        if (GVar1 == 0x1406) {
          return visit_continue_with_parent;
        }
        this->lower_fragdata_array = false;
        return visit_continue_with_parent;
      }
      this->fragdata_usage = this->fragdata_usage | ~(-1 << ((byte)pgVar2->length & 0x1f));
      this->lower_fragdata_array = false;
    }
    else {
      if ((piVar6->data).location != 4) {
        return visit_continue;
      }
      this->texcoord_array = piVar6;
      piVar3 = (ir_constant *)ir->array_index;
      if ((piVar3 != (ir_constant *)0x0) &&
         ((piVar3->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_constant)) {
        uVar5 = ir_constant::get_uint_component(piVar3,0);
        this->texcoord_usage = this->texcoord_usage | 1 << ((byte)uVar5 & 0x1f);
        return visit_continue_with_parent;
      }
      this->texcoord_usage = this->texcoord_usage | ~(-1 << ((byte)pgVar2->length & 0x1f));
      (this->super_ir_hierarchical_visitor).field_0x31 = 0;
    }
    return visit_continue_with_parent;
  }
  return visit_continue;
}

Assistant:

virtual ir_visitor_status visit_enter(ir_dereference_array *ir)
   {
      ir_variable *var = ir->variable_referenced();

      if (!var || var->data.mode != this->mode || !var->type->is_array() ||
          !is_gl_identifier(var->name))
         return visit_continue;

      /* Only match gl_FragData[], not gl_SecondaryFragDataEXT[] or
       * gl_LastFragData[].
       */
      if (this->find_frag_outputs && strcmp(var->name, "gl_FragData") == 0) {
         this->fragdata_array = var;

         ir_constant *index = ir->array_index->as_constant();
         if (index == NULL) {
            /* This is variable indexing. */
            this->fragdata_usage |= (1 << var->type->array_size()) - 1;
            this->lower_fragdata_array = false;
         }
         else {
            this->fragdata_usage |= 1 << index->get_uint_component(0);
            /* Don't lower fragdata array if the output variable
             * is not a float variable (or float vector) because it will
             * generate wrong register assignments because of different
             * data types.
             */
            if (var->type->gl_type != GL_FLOAT &&
                var->type->gl_type != GL_FLOAT_VEC2 &&
                var->type->gl_type != GL_FLOAT_VEC3 &&
                var->type->gl_type != GL_FLOAT_VEC4)
               this->lower_fragdata_array = false;
         }

         /* Don't visit the leaves of ir_dereference_array. */
         return visit_continue_with_parent;
      }

      if (!this->find_frag_outputs && var->data.location == VARYING_SLOT_TEX0) {
         this->texcoord_array = var;

         ir_constant *index = ir->array_index->as_constant();
         if (index == NULL) {
            /* There is variable indexing, we can't lower the texcoord array.
             */
            this->texcoord_usage |= (1 << var->type->array_size()) - 1;
            this->lower_texcoord_array = false;
         }
         else {
            this->texcoord_usage |= 1 << index->get_uint_component(0);
         }

         /* Don't visit the leaves of ir_dereference_array. */
         return visit_continue_with_parent;
      }

      return visit_continue;
   }